

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPrintVisitor.cpp
# Opt level: O2

void __thiscall CPrintVisitor::Visit(CPrintVisitor *this,CMainMethod *stm)

{
  undefined8 uVar1;
  undefined8 uVar2;
  initializer_list<INode_*> __l;
  allocator_type local_c9;
  _Vector_base<INode_*,_std::allocator<INode_*>_> local_c8;
  string local_b0;
  vector<INode_*,_std::allocator<INode_*>_> children;
  ChildrenAnswers answers;
  ChildrenAnswers local_40;
  
  std::operator<<((ostream *)&std::cout,"Point\n");
  answers.descriptions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)(stm->returnType)._M_t.super___uniq_ptr_impl<CType,_std::default_delete<CType>_>.
                _M_t.super__Tuple_impl<0UL,_CType_*,_std::default_delete<CType>_>.
                super__Head_base<0UL,_CType_*,_false>._M_head_impl;
  answers.descriptions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)(stm->args)._M_t.super___uniq_ptr_impl<CIdExp,_std::default_delete<CIdExp>_>._M_t.
                super__Tuple_impl<0UL,_CIdExp_*,_std::default_delete<CIdExp>_>.
                super__Head_base<0UL,_CIdExp_*,_false>._M_head_impl;
  uVar1 = stm->statements;
  uVar2 = stm->vars;
  answers.ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
  ._0_4_ = (int)uVar1;
  answers.descriptions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = uVar2;
  answers.ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
  ._4_4_ = (int)((ulong)uVar1 >> 0x20);
  __l._M_len = 4;
  __l._M_array = (iterator)&answers;
  std::vector<INode_*,_std::allocator<INode_*>_>::vector(&children,__l,&local_c9);
  std::vector<INode_*,_std::allocator<INode_*>_>::vector
            ((vector<INode_*,_std::allocator<INode_*>_> *)&local_c8,&children);
  VisitChildren(&answers,this,(vector<INode_*,_std::allocator<INode_*>_> *)&local_c8);
  std::_Vector_base<INode_*,_std::allocator<INode_*>_>::~_Vector_base(&local_c8);
  ChildrenAnswers::ChildrenAnswers(&local_40,&answers);
  AddChildrenAnswers(this,(ChildrenAnswers *)&local_40);
  ChildrenAnswers::~ChildrenAnswers(&local_40);
  std::__cxx11::string::string((string *)&local_b0,"MainMethod",(allocator *)&local_c9);
  AddLabel(this,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  this->lastVisited = this->lastVisited + 1;
  ChildrenAnswers::~ChildrenAnswers((ChildrenAnswers *)&answers);
  std::_Vector_base<INode_*,_std::allocator<INode_*>_>::~_Vector_base
            (&children.super__Vector_base<INode_*,_std::allocator<INode_*>_>);
  return;
}

Assistant:

void CPrintVisitor::Visit(CMainMethod &stm) {
	std::cout << "Point\n";
	std::vector<INode*> children = { stm.returnType.get(), stm.args.get(), stm.vars.get(), stm.statements.get() };
	ChildrenAnswers answers = VisitChildren(children);
	AddChildrenAnswers(answers);
	AddLabel("MainMethod");
	++lastVisited;
}